

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfogatherer_p.h
# Opt level: O2

Type __thiscall QExtendedInformation::type(QExtendedInformation *this)

{
  char cVar1;
  Type TVar2;
  
  cVar1 = QFileInfo::isDir();
  TVar2 = Dir;
  if (cVar1 == '\0') {
    cVar1 = QFileInfo::isFile();
    if (cVar1 == '\0') {
      cVar1 = QFileInfo::exists();
      TVar2 = System;
      if (cVar1 == '\0') {
        QFileInfo::isSymLink();
      }
    }
    else {
      TVar2 = File;
    }
  }
  return TVar2;
}

Assistant:

Type type() const {
        if (mFileInfo.isDir()) {
            return QExtendedInformation::Dir;
        }
        if (mFileInfo.isFile()) {
            return QExtendedInformation::File;
        }
        if (!mFileInfo.exists() && mFileInfo.isSymLink()) {
            return QExtendedInformation::System;
        }
        return QExtendedInformation::System;
    }